

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitsproc.c
# Opt level: O0

procfits_t *
fitsproc(char *name,char *contact,int noverify,char *dateobs,char *telescop,char *instrume,
        char *detector,char *wavelnth)

{
  sfts_t *key;
  procfits_t *ppVar1;
  char *pcVar2;
  float *pfVar3;
  long in_RCX;
  int in_EDX;
  char *in_RSI;
  undefined8 uVar4;
  sfts_t *in_RDI;
  long in_R8;
  sfts_t *in_R9;
  sfts_t *unaff_retaddr;
  long in_stack_00000008;
  long in_stack_00000010;
  procfits_t *p;
  sfts_t *f;
  int in_stack_00000074;
  size_t *in_stack_00000078;
  size_t *in_stack_00000080;
  sfts_t *in_stack_00000088;
  char *local_58;
  char *local_50;
  char *local_48;
  
  uVar4 = 0;
  if (in_EDX != 0) {
    uVar4 = 0xdeadbeef;
  }
  key = sfts_openro((char *)in_RDI,uVar4);
  sfts_find_hdukey(unaff_retaddr,(char *)in_RDI);
  ppVar1 = (procfits_t *)g_malloc0(0x50);
  pcVar2 = (char *)g_strdup(in_RDI);
  ppVar1->name = pcVar2;
  if (in_RCX == 0) {
    local_48 = sfts_read_keystring(in_R9,(char *)key);
  }
  else {
    local_48 = (char *)g_strdup(in_RCX);
  }
  ppVar1->dateobs = local_48;
  if (in_R8 == 0) {
    pcVar2 = sfts_read_keystring0(in_R9,(char *)key);
    ppVar1->telescop = pcVar2;
    if (ppVar1->telescop == (char *)0x0) {
      pcVar2 = sfts_read_keystring(in_R9,(char *)key);
      ppVar1->telescop = pcVar2;
    }
  }
  else {
    pcVar2 = (char *)g_strdup(in_R8);
    ppVar1->telescop = pcVar2;
  }
  if (in_R9 == (sfts_t *)0x0) {
    local_50 = sfts_read_keystring((sfts_t *)0x0,(char *)key);
  }
  else {
    local_50 = (char *)g_strdup(in_R9);
  }
  ppVar1->instrume = local_50;
  if (in_stack_00000008 == 0) {
    pcVar2 = sfts_read_keystring0(in_R9,(char *)key);
    ppVar1->detector = pcVar2;
    if (ppVar1->detector == (char *)0x0) {
      pcVar2 = (char *)g_strdup(ppVar1->instrume);
      ppVar1->detector = pcVar2;
    }
  }
  else {
    pcVar2 = (char *)g_strdup(in_stack_00000008);
    ppVar1->detector = pcVar2;
  }
  if (in_stack_00000010 == 0) {
    local_58 = sfts_read_keystring(in_R9,(char *)key);
  }
  else {
    local_58 = (char *)g_strdup(in_stack_00000010);
  }
  ppVar1->wavelnth = local_58;
  pcVar2 = process_header(in_RDI,in_RSI);
  ppVar1->xml = pcVar2;
  pfVar3 = (float *)sfts_read_image(in_stack_00000088,in_stack_00000080,in_stack_00000078,
                                    in_stack_00000074);
  ppVar1->im = pfVar3;
  pcVar2 = sfts_free((sfts_t *)contact);
  g_free(pcVar2);
  return ppVar1;
}

Assistant:

procfits_t *fitsproc(const char *name, const char *contact, int noverify,
                     const char *dateobs, const char *telescop, const char *instrume,
                     const char *detector, const char *wavelnth) {
    sfts_t *f = sfts_openro(name, noverify ? SFTS_SUM_NOVERIFY : 0);

    sfts_find_hdukey(f, "DATE-OBS");

    procfits_t *p = (procfits_t *) g_malloc0(sizeof *p);
    p->name = g_strdup(name);
    p->dateobs = dateobs ? g_strdup(dateobs) : sfts_read_keystring(f, "DATE-OBS");

    if (telescop) {
        p->telescop = g_strdup(telescop);
    } else {
        p->telescop = sfts_read_keystring0(f, "TELESCOP");
        if (!p->telescop)
            p->telescop = sfts_read_keystring(f, "OBSRVTRY");
    }

    p->instrume = instrume ? g_strdup(instrume) : sfts_read_keystring(f, "INSTRUME");

    if (detector) {
        p->detector = g_strdup(detector);
    } else {
        p->detector = sfts_read_keystring0(f, "DETECTOR");
        if (!p->detector)
            p->detector = g_strdup(p->instrume);
    }

    p->wavelnth = wavelnth ? g_strdup(wavelnth) : sfts_read_keystring(f, "WAVELNTH");

    p->xml = process_header(f, contact);
    p->im = (float *) sfts_read_image(f, &(p->w), &(p->h), SFLOAT);

    g_free(sfts_free(f));

    return p;
}